

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall
ithipublisher::PrintVector
          (ithipublisher *this,FILE *F,vector<double,_std::allocator<double>_> *vx,double mult)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  bool bVar4;
  ulong local_38;
  size_t i;
  bool ret;
  double mult_local;
  vector<double,_std::allocator<double>_> *vx_local;
  FILE *F_local;
  ithipublisher *this_local;
  
  iVar1 = fprintf((FILE *)F,"[");
  bVar4 = 0 < iVar1;
  local_38 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(vx);
    if (sVar2 <= local_38) break;
    if (local_38 != 0) {
      iVar1 = fprintf((FILE *)F,", ");
      bVar4 = (bool)(bVar4 & 0 < iVar1);
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](vx,local_38);
    iVar1 = fprintf((FILE *)F,"%8f",mult * *pvVar3);
    bVar4 = (bVar4 & 0 < iVar1) != 0;
    local_38 = local_38 + 1;
  }
  iVar1 = fprintf((FILE *)F,"]");
  return (bool)(bVar4 & 0 < iVar1);
}

Assistant:

bool ithipublisher::PrintVector(FILE * F, std::vector<double> * vx, double mult)
{
    bool ret = (fprintf(F, "[") > 0);
    for (size_t i = 0; i < vx->size(); i++)
    {
        if (i != 0)
        {
            ret &= fprintf(F, ", ") > 0;
        }

        ret &= fprintf(F, "%8f", mult*(*vx)[i]) > 0;
    }

    ret &= fprintf(F, "]") > 0;

    return ret;
}